

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O2

CallbackInfo * __thiscall
Js::DynamicProfileInfo::EnsureCallbackInfo
          (DynamicProfileInfo *this,FunctionBody *funcBody,ProfileId callSiteId)

{
  SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *ptr;
  ScriptContext *pSVar1;
  Recycler *alloc;
  Type *pTVar2;
  Recycler *pRVar3;
  undefined1 local_68 [8];
  TrackAllocData data;
  EditingIterator iter;
  
  ptr = FunctionProxy::
        GetAuxPtr<(Js::FunctionProxy::AuxPointerType)25,SList<Js::CallbackInfo*,Memory::Recycler,RealCount>*>
                  ((FunctionProxy *)funcBody);
  if (ptr == (SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)0x0) {
    pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
    pRVar3 = pSVar1->recycler;
    local_68 = (undefined1  [8])&SList<Js::CallbackInfo*,Memory::Recycler,RealCount>::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4871496;
    data.filename._0_4_ = 0x20c;
    alloc = Memory::Recycler::TrackAllocInfo(pRVar3,(TrackAllocData *)local_68);
    ptr = (SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)
          new<Memory::Recycler>(0x18,alloc,0x37a1d4);
    SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::SListBase
              ((SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)ptr);
    ptr->allocator = pRVar3;
    FunctionProxy::
    SetAuxPtr<(Js::FunctionProxy::AuxPointerType)25,SList<Js::CallbackInfo*,Memory::Recycler,RealCount>*>
              ((FunctionProxy *)funcBody,ptr);
  }
  TryFindCallbackInfoIterator((EditingIterator *)&data.line,ptr,callSiteId);
  if ((iter.super_EditingIterator.super_Iterator.list ==
       (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)0x0) ||
     (iter.super_EditingIterator.super_Iterator.list ==
      (SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount> *)data._32_8_)) {
    pSVar1 = FunctionProxy::GetScriptContext((FunctionProxy *)funcBody);
    local_68 = (undefined1  [8])&CallbackInfo::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_4871496;
    data.filename._0_4_ = 0x217;
    pRVar3 = Memory::Recycler::TrackAllocInfo(pSVar1->recycler,(TrackAllocData *)local_68);
    local_68 = (undefined1  [8])new<Memory::Recycler>(0xc,pRVar3,0x51e21e);
    ((CallbackInfo *)local_68)->callSiteId = callSiteId;
    ((CallbackInfo *)local_68)->sourceId = 0xffffffff;
    *(byte *)local_68 = *(byte *)local_68 | 1;
    SList<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::EditingIterator::InsertBefore
              ((EditingIterator *)&data.line,(CallbackInfo **)local_68);
  }
  else {
    pTVar2 = SListBase<Js::CallbackInfo_*,_Memory::Recycler,_RealCount>::Iterator::Data
                       ((Iterator *)&data.line);
    local_68 = (undefined1  [8])pTVar2->ptr;
  }
  return (CallbackInfo *)local_68;
}

Assistant:

CallbackInfo * DynamicProfileInfo::EnsureCallbackInfo(FunctionBody * funcBody, ProfileId callSiteId)
    {
        CallbackInfoList * list = funcBody->GetCallbackInfoList();
        if (list == nullptr)
        {
            Recycler * recycler = funcBody->GetScriptContext()->GetRecycler();
            list = RecyclerNew(recycler, CallbackInfoList, recycler);
            funcBody->SetCallbackInfoList(list);
        }

        CallbackInfoList::EditingIterator iter = TryFindCallbackInfoIterator(list, callSiteId);
        if (iter.IsValid())
        {
            return iter.Data();
        }

        // Callsite is not already in the list, so add it to the end.
        CallbackInfo * info = info = RecyclerNewStructZ(funcBody->GetScriptContext()->GetRecycler(), CallbackInfo);
        info->callSiteId = callSiteId;
        info->sourceId = NoSourceId;
        info->canInlineCallback = true;

        iter.InsertBefore(info);
        return info;
    }